

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Result __thiscall
doctest::detail::Expression_lhs<unsigned_short_const&>::operator==
          (Expression_lhs<unsigned_short_const&> *this,int *rhs)

{
  ushort uVar1;
  uint uVar2;
  void *in_RAX;
  uint *in_RDX;
  EVP_PKEY_CTX *src;
  String extraout_RDX;
  Result RVar3;
  void *local_28;
  
  uVar1 = **(unsigned_short **)rhs;
  uVar2 = *in_RDX;
  local_28 = in_RAX;
  stringifyBinaryExpr<unsigned_short,int>
            ((detail *)&local_28,*(unsigned_short **)rhs," == ",(int *)in_RDX);
  *this = (Expression_lhs<unsigned_short_const&>)(uVar2 == uVar1);
  *(undefined8 *)(this + 8) = 0;
  String::copy((String *)(this + 8),(EVP_PKEY_CTX *)&local_28,src);
  free(local_28);
  RVar3.m_decomposition.m_str = extraout_RDX.m_str;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Result operator< (const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs <  rhs, stringifyBinaryExpr(lhs, " < " , rhs)); }